

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::drawFrameDecoration
          (QTextDocumentLayoutPrivate *this,QPainter *painter,QTextFrame *frame,QTextFrameData *fd,
          QRectF *clip,QRectF *rect)

{
  QBrush *this_00;
  int iVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  BorderStyle style;
  QTextFrame *pQVar7;
  QPaintDevice *pQVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 local_a0 [16];
  QBrush bg;
  QTextFormat local_88;
  QRectF local_78;
  undefined1 local_58 [8];
  double dStack_50;
  qreal local_48;
  qreal qStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bg.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::frameFormat((QTextFrame *)local_58);
  QTextFormat::background((QTextFormat *)&bg);
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  auVar4._12_4_ = 0;
  auVar4._0_12_ = stack0xffffffffffffffac;
  _local_58 = (QTextFormat)(auVar4 << 0x20);
  bVar5 = ::operator!=(&bg,(BrushStyle *)local_58);
  if (bVar5) {
    iVar6 = (fd->border).val;
    dVar9 = (double)((fd->leftMargin).val + iVar6) * 0.015625;
    dVar10 = (double)((fd->topMargin).val + iVar6) * 0.015625;
    dVar2 = rect->xp + dVar9;
    dVar3 = rect->yp + dVar10;
    uVar11 = SUB84(dVar3,0);
    uVar12 = (undefined4)((ulong)dVar3 >> 0x20);
    unique0x10000122 = uVar11;
    local_58 = (undefined1  [8])dVar2;
    unique0x10000126 = uVar12;
    local_48 = ((double)((fd->rightMargin).val + iVar6) * -0.015625 - dVar9) + rect->w;
    qStack_40 = ((double)((fd->bottomMargin).val + iVar6) * -0.015625 - dVar10) + rect->h;
    local_78.w = 0.0;
    local_78.h = 0.0;
    local_78.xp = 0.0;
    local_78.yp = 0.0;
    local_88.format_type = uVar11;
    local_88.d.d.ptr =
         (totally_ordered_wrapper<QTextFormatPrivate_*>)
         (totally_ordered_wrapper<QTextFormatPrivate_*>)dVar2;
    local_88._12_4_ = uVar12;
    pQVar7 = QTextFrame::parentFrame(frame);
    if (pQVar7 == (QTextFrame *)0x0) {
      _local_58 = *(QTextFormat *)clip;
      local_48 = clip->w;
      qStack_40 = clip->h;
      pQVar8 = QPainter::device(painter);
      iVar6 = (*pQVar8->_vptr_QPaintDevice[4])(pQVar8,1);
      local_78.w = (qreal)iVar6;
      pQVar8 = QPainter::device(painter);
      iVar6 = (*pQVar8->_vptr_QPaintDevice[4])(pQVar8,2);
      local_78.h = (qreal)iVar6;
    }
    this_00 = (QBrush *)(local_a0 + 8);
    QBrush::QBrush(this_00,&bg);
    fillBackground(painter,(QRectF *)local_58,this_00,(QPointF *)&local_88,&local_78);
    QBrush::~QBrush(this_00);
  }
  if ((fd->border).val != 0) {
    QPainter::save(painter);
    QPainter::setBrush(painter,lightGray);
    QPainter::setPen(painter,NoPen);
    dVar9 = (double)(fd->border).val * 0.015625;
    dVar2 = (double)(fd->leftMargin).val * 0.015625;
    dVar3 = (double)(fd->topMargin).val * 0.015625;
    dStack_50 = rect->yp + dVar3;
    local_58 = (undefined1  [8])(rect->xp + dVar2);
    local_48 = (((rect->w - (dVar9 + dVar9)) - dVar2) - (double)(fd->rightMargin).val * 0.015625) +
               dVar9;
    qStack_40 = (((rect->h - (dVar9 + dVar9)) - dVar3) - (double)(fd->bottomMargin).val * 0.015625)
                + dVar9;
    iVar6 = (fd->effectiveTopMargin).val;
    iVar1 = (fd->effectiveBottomMargin).val;
    QTextFrame::frameFormat((QTextFrame *)&local_78);
    QTextFrameFormat::borderBrush((QTextFrameFormat *)local_a0);
    QTextFrame::frameFormat((QTextFrame *)&local_88);
    style = QTextFrameFormat::borderStyle((QTextFrameFormat *)&local_88);
    drawBorder(this,painter,(QRectF *)local_58,(double)iVar6 * 0.015625,(double)iVar1 * 0.015625,
               dVar9,(QBrush *)local_a0,style);
    QTextFormat::~QTextFormat(&local_88);
    QBrush::~QBrush((QBrush *)local_a0);
    QTextFormat::~QTextFormat((QTextFormat *)&local_78);
    QPainter::restore(painter);
  }
  QBrush::~QBrush(&bg);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawFrameDecoration(QPainter *painter, QTextFrame *frame, QTextFrameData *fd, const QRectF &clip, const QRectF &rect) const
{

    const QBrush bg = frame->frameFormat().background();
    if (bg != Qt::NoBrush) {
        QRectF bgRect = rect;
        bgRect.adjust((fd->leftMargin + fd->border).toReal(),
                      (fd->topMargin + fd->border).toReal(),
                      - (fd->rightMargin + fd->border).toReal(),
                      - (fd->bottomMargin + fd->border).toReal());

        QRectF gradientRect; // invalid makes it default to bgRect
        QPointF origin = bgRect.topLeft();
        if (!frame->parentFrame()) {
            bgRect = clip;
            gradientRect.setWidth(painter->device()->width());
            gradientRect.setHeight(painter->device()->height());
        }
        fillBackground(painter, bgRect, bg, origin, gradientRect);
    }
    if (fd->border != 0) {
        painter->save();
        painter->setBrush(Qt::lightGray);
        painter->setPen(Qt::NoPen);

        const qreal leftEdge = rect.left() + fd->leftMargin.toReal();
        const qreal border = fd->border.toReal();
        const qreal topMargin = fd->topMargin.toReal();
        const qreal leftMargin = fd->leftMargin.toReal();
        const qreal bottomMargin = fd->bottomMargin.toReal();
        const qreal rightMargin = fd->rightMargin.toReal();
        const qreal w = rect.width() - 2 * border - leftMargin - rightMargin;
        const qreal h = rect.height() - 2 * border - topMargin - bottomMargin;

        drawBorder(painter, QRectF(leftEdge, rect.top() + topMargin, w + border, h + border),
                   fd->effectiveTopMargin.toReal(), fd->effectiveBottomMargin.toReal(),
                   border, frame->frameFormat().borderBrush(), frame->frameFormat().borderStyle());

        painter->restore();
    }
}